

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

bool __thiscall tinyusdz::Attribute::is_value(Attribute *this)

{
  vtable_type *pvVar1;
  bool bVar2;
  byte bVar3;
  uint32_t uVar4;
  
  bVar2 = is_connection(this);
  if (!bVar2) {
    bVar2 = is_timesamples(this);
    if (!bVar2) {
      bVar3 = 1;
      if ((this->_var)._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          (this->_var)._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        pvVar1 = (this->_var)._value.v_.vtable;
        if (pvVar1 == (vtable_type *)0x0) {
          bVar2 = false;
        }
        else {
          uVar4 = (*pvVar1->type_id)();
          bVar2 = uVar4 == 4;
        }
        bVar3 = (bVar2 | (this->_var)._blocked) ^ 1;
      }
      goto LAB_005c53bd;
    }
  }
  bVar3 = 0;
LAB_005c53bd:
  return (bool)(bVar3 & 1);
}

Assistant:

bool is_value() const {
    if (is_connection()) {
      return false;
    }

    if (is_timesamples()) {
      return false;
    }

    if (is_blocked()) {
      return false;
    }

    return true;
  }